

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.c
# Opt level: O3

void hashtable_do_clear(hashtable_t *hashtable)

{
  hashtable_list *phVar1;
  hashtable_list *json;
  hashtable_list *phVar2;
  hashtable_list *ptr;
  
  ptr = (hashtable->list).next;
  while (ptr != &hashtable->list) {
    phVar1 = ptr->next;
    json = ptr[2].next;
    if (((json != (hashtable_list *)0x0) && (json->next != (hashtable_list *)0xffffffffffffffff)) &&
       (phVar2 = (hashtable_list *)((long)&json->next[-1].next + 7), json->next = phVar2,
       phVar2 == (hashtable_list *)0x0)) {
      json_delete((json_t *)json);
    }
    jsonp_free(ptr);
    ptr = phVar1;
  }
  return;
}

Assistant:

static void hashtable_do_clear(hashtable_t *hashtable)
{
    list_t *list, *next;
    pair_t *pair;

    for(list = hashtable->list.next; list != &hashtable->list; list = next)
    {
        next = list->next;
        pair = list_to_pair(list);
        json_decref(pair->value);
        jsonp_free(pair);
    }
}